

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O1

wchar_t lzx_read_bitlen(lzx_stream *strm,huffman *d,wchar_t end)

{
  lzx_br *br;
  ushort uVar1;
  lzx_dec *plVar2;
  uchar *puVar3;
  wchar_t wVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  wchar_t wVar10;
  wchar_t wVar11;
  bool bVar12;
  
  plVar2 = strm->ds;
  wVar10 = plVar2->loop;
  if (wVar10 == L'\0') {
    d->freq[0xc] = L'\0';
    d->freq[0xd] = L'\0';
    d->freq[0xe] = L'\0';
    d->freq[0xf] = L'\0';
    d->freq[8] = L'\0';
    d->freq[9] = L'\0';
    d->freq[10] = L'\0';
    d->freq[0xb] = L'\0';
    d->freq[4] = L'\0';
    d->freq[5] = L'\0';
    d->freq[6] = L'\0';
    d->freq[7] = L'\0';
    d->freq[0] = L'\0';
    d->freq[1] = L'\0';
    d->freq[2] = L'\0';
    d->freq[3] = L'\0';
    d->freq[0x10] = L'\0';
  }
  if (end < L'\0') {
    end = d->len_size;
  }
  wVar4 = L'\x01';
  if (wVar10 < end) {
    br = &plVar2->br;
    do {
      plVar2->loop = wVar10;
      if ((((plVar2->br).cache_avail < (plVar2->pt).max_bits) &&
          (wVar4 = lzx_br_fillup(strm,br), wVar4 == L'\0')) &&
         ((plVar2->br).cache_avail < (plVar2->pt).max_bits)) {
LAB_00571c4b:
        wVar4 = L'\0';
        goto LAB_00571c4d;
      }
      wVar4 = (plVar2->br).cache_avail;
      wVar11 = (plVar2->pt).max_bits;
      uVar1 = (plVar2->pt).tbl
              [(uint)((plVar2->br).cache_buffer >> ((char)wVar4 - (char)wVar11 & 0x3fU)) &
               cache_masks[wVar11]];
      uVar9 = (ulong)uVar1;
      if ((plVar2->pt).len_size <= (int)(uint)uVar1) {
        uVar9 = 0;
      }
      iVar6 = (int)uVar9;
      if (iVar6 == 0x13) {
        if (((wVar4 < (uint)(plVar2->pt).bitlen[0x13] + wVar11 + L'\x01') &&
            (wVar4 = lzx_br_fillup(strm,br), wVar4 == L'\0')) &&
           ((plVar2->br).cache_avail <
            (uint)(plVar2->pt).bitlen[0x13] + (plVar2->pt).max_bits + L'\x01')) goto LAB_00571c4b;
        puVar3 = (plVar2->pt).bitlen;
        wVar4 = (plVar2->br).cache_avail - (uint)puVar3[0x13];
        (plVar2->br).cache_avail = wVar4;
        uVar9 = (plVar2->br).cache_buffer;
        wVar4 = wVar4 + L'\xffffffff';
        bVar12 = (uVar9 >> ((ulong)(uint)wVar4 & 0x3f) & 1) != 0;
        if (end < (uint)bVar12 + wVar10 + L'\x04') {
          return L'\xffffffff';
        }
        (plVar2->br).cache_avail = wVar4;
        wVar11 = (plVar2->pt).max_bits;
        uVar1 = (plVar2->pt).tbl
                [(uint)(uVar9 >> ((char)wVar4 - (char)wVar11 & 0x3fU)) & cache_masks[wVar11]];
        uVar9 = (ulong)uVar1;
        if ((plVar2->pt).len_size <= (int)(uint)uVar1) {
          uVar9 = 0;
        }
        (plVar2->br).cache_avail = wVar4 - (uint)puVar3[uVar9];
        lVar5 = (long)wVar10;
        uVar7 = (int)(((uint)d->bitlen[lVar5] - (int)uVar9) + 0x11) % 0x11;
        if ((int)uVar7 < 0) {
          return L'\xffffffff';
        }
        uVar8 = (uint)bVar12;
        iVar6 = 0;
        do {
          d->bitlen[lVar5] = (uchar)uVar7;
          lVar5 = lVar5 + 1;
          iVar6 = iVar6 + -1;
        } while (-4 - uVar8 != iVar6);
        wVar10 = wVar10 - iVar6;
        d->freq[uVar7] = d->freq[uVar7] + (uVar8 | 4);
      }
      else if (iVar6 == 0x12) {
        if (((wVar4 < (uint)(plVar2->pt).bitlen[0x12] + L'\x05') &&
            (wVar4 = lzx_br_fillup(strm,br), wVar4 == L'\0')) &&
           ((plVar2->br).cache_avail < (uint)(plVar2->pt).bitlen[0x12] + L'\x05'))
        goto LAB_00571c4b;
        wVar4 = (plVar2->br).cache_avail - (uint)(plVar2->pt).bitlen[0x12];
        (plVar2->br).cache_avail = wVar4;
        wVar4 = wVar4 + L'\xfffffffb';
        uVar7 = (uint)((plVar2->br).cache_buffer >> ((byte)wVar4 & 0x3f)) & 0x1f;
        wVar11 = uVar7 + wVar10 + L'\x14';
        if (end < wVar11) {
          return L'\xffffffff';
        }
        (plVar2->br).cache_avail = wVar4;
        memset(d->bitlen + wVar10,0,(ulong)(uVar7 + 0x14));
        wVar10 = wVar11;
      }
      else if (iVar6 == 0x11) {
        if (((wVar4 < (uint)(plVar2->pt).bitlen[0x11] + L'\x04') &&
            (wVar4 = lzx_br_fillup(strm,br), wVar4 == L'\0')) &&
           ((plVar2->br).cache_avail < (uint)(plVar2->pt).bitlen[0x11] + L'\x04'))
        goto LAB_00571c4b;
        wVar4 = (plVar2->br).cache_avail - (uint)(plVar2->pt).bitlen[0x11];
        (plVar2->br).cache_avail = wVar4;
        wVar4 = wVar4 + L'\xfffffffc';
        uVar7 = (uint)((plVar2->br).cache_buffer >> ((byte)wVar4 & 0x3f)) & 0xf;
        if (end < uVar7 + wVar10 + L'\x04') {
          return L'\xffffffff';
        }
        (plVar2->br).cache_avail = wVar4;
        lVar5 = (long)wVar10;
        iVar6 = 0;
        do {
          d->bitlen[lVar5] = '\0';
          lVar5 = lVar5 + 1;
          iVar6 = iVar6 + -1;
        } while (-4 - uVar7 != iVar6);
        wVar10 = wVar10 - iVar6;
      }
      else {
        (plVar2->br).cache_avail = wVar4 - (uint)(plVar2->pt).bitlen[uVar9];
        puVar3 = d->bitlen;
        uVar7 = (int)(((uint)puVar3[wVar10] - iVar6) + 0x11) % 0x11;
        if ((int)uVar7 < 0) {
          return L'\xffffffff';
        }
        d->freq[uVar7] = d->freq[uVar7] + L'\x01';
        puVar3[wVar10] = (uchar)uVar7;
        wVar10 = wVar10 + L'\x01';
      }
    } while (wVar10 < end);
    wVar4 = L'\x01';
  }
LAB_00571c4d:
  plVar2->loop = wVar10;
  return wVar4;
}

Assistant:

static int
lzx_read_bitlen(struct lzx_stream *strm, struct huffman *d, int end)
{
	struct lzx_dec *ds = strm->ds;
	struct lzx_br *br = &(ds->br);
	int c, i, j, ret, same;
	unsigned rbits;

	i = ds->loop;
	if (i == 0)
		memset(d->freq, 0, sizeof(d->freq));
	ret = 0;
	if (end < 0)
		end = d->len_size;
	while (i < end) {
		ds->loop = i;
		if (!lzx_br_read_ahead(strm, br, ds->pt.max_bits))
			goto getdata;
		rbits = lzx_br_bits(br, ds->pt.max_bits);
		c = lzx_decode_huffman(&(ds->pt), rbits);
		switch (c) {
		case 17:/* several zero lengths, from 4 to 19. */
			if (!lzx_br_read_ahead(strm, br, ds->pt.bitlen[c]+4))
				goto getdata;
			lzx_br_consume(br, ds->pt.bitlen[c]);
			same = lzx_br_bits(br, 4) + 4;
			if (i + same > end)
				return (-1);/* Invalid */
			lzx_br_consume(br, 4);
			for (j = 0; j < same; j++)
				d->bitlen[i++] = 0;
			break;
		case 18:/* many zero lengths, from 20 to 51. */
			if (!lzx_br_read_ahead(strm, br, ds->pt.bitlen[c]+5))
				goto getdata;
			lzx_br_consume(br, ds->pt.bitlen[c]);
			same = lzx_br_bits(br, 5) + 20;
			if (i + same > end)
				return (-1);/* Invalid */
			lzx_br_consume(br, 5);
			memset(d->bitlen + i, 0, same);
			i += same;
			break;
		case 19:/* a few same lengths. */
			if (!lzx_br_read_ahead(strm, br,
			    ds->pt.bitlen[c]+1+ds->pt.max_bits))
				goto getdata;
			lzx_br_consume(br, ds->pt.bitlen[c]);
			same = lzx_br_bits(br, 1) + 4;
			if (i + same > end)
				return (-1);
			lzx_br_consume(br, 1);
			rbits = lzx_br_bits(br, ds->pt.max_bits);
			c = lzx_decode_huffman(&(ds->pt), rbits);
			lzx_br_consume(br, ds->pt.bitlen[c]);
			c = (d->bitlen[i] - c + 17) % 17;
			if (c < 0)
				return (-1);/* Invalid */
			for (j = 0; j < same; j++)
				d->bitlen[i++] = c;
			d->freq[c] += same;
			break;
		default:
			lzx_br_consume(br, ds->pt.bitlen[c]);
			c = (d->bitlen[i] - c + 17) % 17;
			if (c < 0)
				return (-1);/* Invalid */
			d->freq[c]++;
			d->bitlen[i++] = c;
			break;
		}
	}
	ret = 1;
getdata:
	ds->loop = i;
	return (ret);
}